

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream *dctx,ZSTD_DDict *ddict)

{
  dctx->streamStage = zdss_init;
  dctx->noForwardProgress = 0;
  ZSTD_freeDDict(dctx->ddictLocal);
  dctx->dictUses = ZSTD_dont_use;
  dctx->ddictLocal = (ZSTD_DDict *)0x0;
  dctx->ddict = (ZSTD_DDict *)0x0;
  if (ddict != (ZSTD_DDict *)0x0) {
    dctx->ddict = ddict;
    dctx->dictUses = ZSTD_use_indefinitely;
  }
  if (dctx->format < 2) {
    return (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1;
  }
  __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5a00,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
}

Assistant:

size_t ZSTD_initDStream_usingDDict(ZSTD_DStream* dctx, const ZSTD_DDict* ddict)
{
    FORWARD_IF_ERROR( ZSTD_DCtx_reset(dctx, ZSTD_reset_session_only) );
    FORWARD_IF_ERROR( ZSTD_DCtx_refDDict(dctx, ddict) );
    return ZSTD_startingInputLength(dctx->format);
}